

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::Invert(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,uint8_t *outYEnd,
                uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  uint8_t *puVar5;
  undefined1 in_ZMM0 [64];
  
  auVar1 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  puVar5 = inY + totalSimdWidth;
  puVar2 = outY + totalSimdWidth;
  for (; outY != outYEnd; outY = outY + rowSizeOut) {
    for (lVar3 = 0; (ulong)simdWidth << 4 != lVar3; lVar3 = lVar3 + 0x10) {
      *(undefined1 (*) [16])(outY + lVar3) = auVar1 ^ *(undefined1 (*) [16])(inY + lVar3);
    }
    if (nonSimdWidth != 0) {
      for (uVar4 = 0; nonSimdWidth != uVar4; uVar4 = uVar4 + 1) {
        puVar2[uVar4] = ~puVar5[uVar4];
      }
    }
    inY = inY + rowSizeIn;
    puVar5 = puVar5 + rowSizeIn;
    puVar2 = puVar2 + rowSizeOut;
  }
  return;
}

Assistant:

void Invert( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd,
                 uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const char maskValue = static_cast<char>(0xffu);
        const simd mask = _mm_set_epi8( maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                                        maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue );

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src1 = reinterpret_cast <const simd*> (inY);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++dst )
                _mm_storeu_si128( dst, _mm_andnot_si128( _mm_loadu_si128( src1 ), mask ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY  + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++inX )
                    (*outX) = ~(*inX);
            }
        }
    }